

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O0

bool fmt::v5::internal::grisu2_gen_digits
               (char *buf,int *size,uint32_t hi,uint64_t lo,int *exp,uint64_t delta,fp *one,fp *diff
               ,int max_digits)

{
  int iVar1;
  bool bVar2;
  char cVar3;
  ulong remainder_00;
  ulong in_RCX;
  uint in_EDX;
  int *in_RSI;
  char *in_RDI;
  int *in_R8;
  ulong in_R9;
  uint64_t *in_stack_00000008;
  uint64_t *in_stack_00000010;
  int in_stack_00000018;
  char digit_1;
  uint64_t remainder;
  uint32_t digit;
  uint local_3c;
  ulong local_38;
  ulong local_28;
  uint local_1c;
  
  local_1c = in_EDX;
  do {
    local_38 = in_R9;
    local_28 = in_RCX;
    if (*in_R8 < 1) {
      do {
        local_38 = local_38 * 10;
        cVar3 = (char)(local_28 * 10 >> (-(char)(int)in_stack_00000008[1] & 0x3fU));
        if ((cVar3 != '\0') || (*in_RSI != 0)) {
          iVar1 = *in_RSI;
          *in_RSI = iVar1 + 1;
          in_RDI[iVar1] = cVar3 + '0';
        }
        local_28 = *in_stack_00000008 - 1 & local_28 * 10;
        *in_R8 = *in_R8 + -1;
      } while ((local_38 <= local_28) && (*in_RSI <= in_stack_00000018));
      bVar2 = grisu2_round(in_RDI,in_RSI,in_stack_00000018,local_38,local_28,*in_stack_00000008,
                           *in_stack_00000010 *
                           (ulong)*(uint *)(basic_data<void>::POWERS_OF_10_32 + (long)-*in_R8 * 4),
                           in_R8);
      return bVar2;
    }
    local_3c = 0;
    switch(*in_R8) {
    case 1:
      local_3c = local_1c;
      local_1c = 0;
      break;
    case 2:
      local_3c = local_1c / 10;
      local_1c = local_1c % 10;
      break;
    case 3:
      local_3c = local_1c / 100;
      local_1c = local_1c % 100;
      break;
    case 4:
      local_3c = local_1c / 1000;
      local_1c = local_1c % 1000;
      break;
    case 5:
      local_3c = local_1c / 10000;
      local_1c = local_1c % 10000;
      break;
    case 6:
      local_3c = local_1c / 100000;
      local_1c = local_1c % 100000;
      break;
    case 7:
      local_3c = local_1c / 1000000;
      local_1c = local_1c % 1000000;
      break;
    case 8:
      local_3c = local_1c / 10000000;
      local_1c = local_1c % 10000000;
      break;
    case 9:
      local_3c = local_1c / 100000000;
      local_1c = local_1c % 100000000;
      break;
    case 10:
      local_3c = local_1c / 1000000000;
      local_1c = local_1c % 1000000000;
    }
    if ((local_3c != 0) || (*in_RSI != 0)) {
      iVar1 = *in_RSI;
      *in_RSI = iVar1 + 1;
      in_RDI[iVar1] = (char)local_3c + '0';
    }
    *in_R8 = *in_R8 + -1;
    remainder_00 = ((ulong)local_1c << (-(char)(int)in_stack_00000008[1] & 0x3fU)) + in_RCX;
  } while ((in_R9 < remainder_00) && (*in_RSI <= in_stack_00000018));
  bVar2 = grisu2_round(in_RDI,in_RSI,in_stack_00000018,in_R9,remainder_00,
                       (ulong)*(uint *)(basic_data<void>::POWERS_OF_10_32 + (long)*in_R8 * 4) <<
                       (-(char)(int)in_stack_00000008[1] & 0x3fU),*in_stack_00000010,in_R8);
  return bVar2;
}

Assistant:

FMT_FUNC bool grisu2_gen_digits(
    char *buf, int &size, uint32_t hi, uint64_t lo, int &exp,
    uint64_t delta, const fp &one, const fp &diff, int max_digits) {
  // Generate digits for the most significant part (hi).
  while (exp > 0) {
    uint32_t digit = 0;
    // This optimization by miloyip reduces the number of integer divisions by
    // one per iteration.
    switch (exp) {
    case 10: digit = hi / 1000000000; hi %= 1000000000; break;
    case  9: digit = hi /  100000000; hi %=  100000000; break;
    case  8: digit = hi /   10000000; hi %=   10000000; break;
    case  7: digit = hi /    1000000; hi %=    1000000; break;
    case  6: digit = hi /     100000; hi %=     100000; break;
    case  5: digit = hi /      10000; hi %=      10000; break;
    case  4: digit = hi /       1000; hi %=       1000; break;
    case  3: digit = hi /        100; hi %=        100; break;
    case  2: digit = hi /         10; hi %=         10; break;
    case  1: digit = hi;              hi =           0; break;
    default:
      FMT_ASSERT(false, "invalid number of digits");
    }
    if (digit != 0 || size != 0)
      buf[size++] = static_cast<char>('0' + digit);
    --exp;
    uint64_t remainder = (static_cast<uint64_t>(hi) << -one.e) + lo;
    if (remainder <= delta || size > max_digits) {
      return grisu2_round(
            buf, size, max_digits, delta, remainder,
            static_cast<uint64_t>(data::POWERS_OF_10_32[exp]) << -one.e,
            diff.f, exp);
    }
  }
  // Generate digits for the least significant part (lo).
  for (;;) {
    lo *= 10;
    delta *= 10;
    char digit = static_cast<char>(lo >> -one.e);
    if (digit != 0 || size != 0)
      buf[size++] = static_cast<char>('0' + digit);
    lo &= one.f - 1;
    --exp;
    if (lo < delta || size > max_digits) {
      return grisu2_round(buf, size, max_digits, delta, lo, one.f,
                          diff.f * data::POWERS_OF_10_32[-exp], exp);
    }
  }
}